

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O0

void __thiscall uttt::IBoard::MirrorVertical(IBoard *this)

{
  value_type_conflict2 vVar1;
  value_type_conflict2 vVar2;
  value_type_conflict2 vVar3;
  value_type_conflict2 vVar4;
  value_type_conflict2 vVar5;
  value_type_conflict2 vVar6;
  value_type_conflict2 vVar7;
  value_type_conflict2 vVar8;
  iterator pvVar9;
  reference pvVar10;
  int *in_RDI;
  value_type_conflict2 *m;
  iterator __end1;
  iterator __begin1;
  array<short,_9UL> *__range1;
  undefined6 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc6;
  value_type_conflict2 vVar11;
  short *local_18;
  
  *in_RDI = g_macro_mirrored_vertical[*in_RDI];
  local_18 = std::array<short,_9UL>::begin((array<short,_9UL> *)0x244264);
  pvVar9 = std::array<short,_9UL>::end((array<short,_9UL> *)0x244273);
  for (; local_18 != pvVar9; local_18 = local_18 + 1) {
    *local_18 = (short)g_mirrored_vertical[*local_18];
  }
  pvVar10 = std::array<short,_9UL>::operator[]
                      ((array<short,_9UL> *)
                       CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0),
                       (size_type)in_RDI);
  vVar11 = *pvVar10;
  pvVar10 = std::array<short,_9UL>::operator[]
                      ((array<short,_9UL> *)CONCAT26(vVar11,in_stack_ffffffffffffffc0),
                       (size_type)in_RDI);
  vVar1 = *pvVar10;
  pvVar10 = std::array<short,_9UL>::operator[]
                      ((array<short,_9UL> *)CONCAT26(vVar11,in_stack_ffffffffffffffc0),
                       (size_type)in_RDI);
  vVar2 = *pvVar10;
  pvVar10 = std::array<short,_9UL>::operator[]
                      ((array<short,_9UL> *)CONCAT26(vVar11,in_stack_ffffffffffffffc0),
                       (size_type)in_RDI);
  vVar3 = *pvVar10;
  pvVar10 = std::array<short,_9UL>::operator[]
                      ((array<short,_9UL> *)CONCAT26(vVar11,in_stack_ffffffffffffffc0),
                       (size_type)in_RDI);
  vVar4 = *pvVar10;
  pvVar10 = std::array<short,_9UL>::operator[]
                      ((array<short,_9UL> *)CONCAT26(vVar11,in_stack_ffffffffffffffc0),
                       (size_type)in_RDI);
  vVar5 = *pvVar10;
  pvVar10 = std::array<short,_9UL>::operator[]
                      ((array<short,_9UL> *)CONCAT26(vVar11,in_stack_ffffffffffffffc0),
                       (size_type)in_RDI);
  vVar6 = *pvVar10;
  pvVar10 = std::array<short,_9UL>::operator[]
                      ((array<short,_9UL> *)CONCAT26(vVar11,in_stack_ffffffffffffffc0),
                       (size_type)in_RDI);
  vVar7 = *pvVar10;
  pvVar10 = std::array<short,_9UL>::operator[]
                      ((array<short,_9UL> *)CONCAT26(vVar11,in_stack_ffffffffffffffc0),
                       (size_type)in_RDI);
  vVar8 = *pvVar10;
  *(ulong *)(in_RDI + 1) = CONCAT26(vVar3,CONCAT24(vVar2,CONCAT22(vVar1,vVar11)));
  *(ulong *)(in_RDI + 3) = CONCAT26(vVar7,CONCAT24(vVar6,CONCAT22(vVar5,vVar4)));
  *(value_type_conflict2 *)(in_RDI + 5) = vVar8;
  if (*(char *)((long)in_RDI + 0x16) != -1) {
    *(int8_t *)((long)in_RDI + 0x16) = g_next_mirrored_vertical[*(char *)((long)in_RDI + 0x16)];
  }
  return;
}

Assistant:

void
IBoard::MirrorVertical()
{
    macro = g_macro_mirrored_vertical[macro];
    for (auto &m : micro)
        m = g_mirrored_vertical[m];
    micro = {{micro[2], micro[1], micro[0], micro[5], micro[4], micro[3], micro[8], micro[7], micro[6]}};
    if (next != -1)
        next = g_next_mirrored_vertical[next];
}